

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cpp
# Opt level: O1

timestamp_sec_t __thiscall duckdb::Value::GetValueInternal<duckdb::timestamp_sec_t>(Value *this)

{
  LogicalTypeId LVar1;
  PhysicalType PVar2;
  timestamp_t input;
  bool bVar3;
  timestamp_sec_t tVar4;
  NotImplementedException *pNVar5;
  InternalException *pIVar6;
  timestamp_sec_t input_00;
  duckdb *this_00;
  string *__return_storage_ptr__;
  undefined1 auVar7 [16];
  timestamp_sec_t result_1;
  timestamp_sec_t result;
  LogicalType local_98;
  Value local_80;
  string local_40;
  
  if (this->is_null == true) {
    pIVar6 = (InternalException *)__cxa_allocate_exception(0x10);
    local_80.type_._0_8_ =
         &local_80.type_.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_80,"Calling GetValueInternal on a value that is NULL","");
    InternalException::InternalException(pIVar6,(string *)&local_80);
    __cxa_throw(pIVar6,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  }
  LVar1 = (this->type_).id_;
  switch(LVar1) {
  case BOOLEAN:
    pNVar5 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    local_80.type_._0_8_ =
         &local_80.type_.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    local_98.id_ = INTEGER_LITERAL;
    local_98.physical_type_ = ~INVALID;
    local_98._2_6_ = 0;
    local_80.type_._0_8_ = ::std::__cxx11::string::_M_create((ulong *)&local_80,(ulong)&local_98);
    local_80.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._0_8_;
    builtin_strncpy((char *)local_80.type_._0_8_,"Unimplemented type for cast (%s -> %s)",0x26);
    local_80.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_98._0_8_;
    *(char *)(local_80.type_._0_8_ + local_98._0_8_) = '\0';
    NotImplementedException::NotImplementedException<duckdb::PhysicalType,duckdb::PhysicalType>
              (pNVar5,(string *)&local_80,BOOL,INT64);
    __cxa_throw(pNVar5,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  case TINYINT:
    pNVar5 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    local_80.type_._0_8_ =
         &local_80.type_.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    local_98.id_ = INTEGER_LITERAL;
    local_98.physical_type_ = ~INVALID;
    local_98._2_6_ = 0;
    local_80.type_._0_8_ = ::std::__cxx11::string::_M_create((ulong *)&local_80,(ulong)&local_98);
    local_80.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._0_8_;
    builtin_strncpy((char *)local_80.type_._0_8_,"Unimplemented type for cast (%s -> %s)",0x26);
    local_80.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_98._0_8_;
    *(char *)(local_80.type_._0_8_ + local_98._0_8_) = '\0';
    NotImplementedException::NotImplementedException<duckdb::PhysicalType,duckdb::PhysicalType>
              (pNVar5,(string *)&local_80,INT8,INT64);
    __cxa_throw(pNVar5,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  case SMALLINT:
    pNVar5 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    local_80.type_._0_8_ =
         &local_80.type_.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    local_98.id_ = INTEGER_LITERAL;
    local_98.physical_type_ = ~INVALID;
    local_98._2_6_ = 0;
    local_80.type_._0_8_ = ::std::__cxx11::string::_M_create((ulong *)&local_80,(ulong)&local_98);
    local_80.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._0_8_;
    builtin_strncpy((char *)local_80.type_._0_8_,"Unimplemented type for cast (%s -> %s)",0x26);
    local_80.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_98._0_8_;
    *(char *)(local_80.type_._0_8_ + local_98._0_8_) = '\0';
    NotImplementedException::NotImplementedException<duckdb::PhysicalType,duckdb::PhysicalType>
              (pNVar5,(string *)&local_80,INT16,INT64);
    __cxa_throw(pNVar5,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  case INTEGER:
    pNVar5 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    local_80.type_._0_8_ =
         &local_80.type_.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    local_98.id_ = INTEGER_LITERAL;
    local_98.physical_type_ = ~INVALID;
    local_98._2_6_ = 0;
    local_80.type_._0_8_ = ::std::__cxx11::string::_M_create((ulong *)&local_80,(ulong)&local_98);
    local_80.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._0_8_;
    builtin_strncpy((char *)local_80.type_._0_8_,"Unimplemented type for cast (%s -> %s)",0x26);
    local_80.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_98._0_8_;
    *(char *)(local_80.type_._0_8_ + local_98._0_8_) = '\0';
    NotImplementedException::NotImplementedException<duckdb::PhysicalType,duckdb::PhysicalType>
              (pNVar5,(string *)&local_80,INT32,INT64);
    __cxa_throw(pNVar5,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  case BIGINT:
    pNVar5 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    local_80.type_._0_8_ =
         &local_80.type_.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    local_98.id_ = INTEGER_LITERAL;
    local_98.physical_type_ = ~INVALID;
    local_98._2_6_ = 0;
    local_80.type_._0_8_ = ::std::__cxx11::string::_M_create((ulong *)&local_80,(ulong)&local_98);
    local_80.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._0_8_;
    builtin_strncpy((char *)local_80.type_._0_8_,"Unimplemented type for cast (%s -> %s)",0x26);
    local_80.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_98._0_8_;
    *(char *)(local_80.type_._0_8_ + local_98._0_8_) = '\0';
    NotImplementedException::NotImplementedException<duckdb::PhysicalType,duckdb::PhysicalType>
              (pNVar5,(string *)&local_80,INT64,INT64);
    __cxa_throw(pNVar5,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  case DATE:
    pNVar5 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    local_80.type_._0_8_ =
         &local_80.type_.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    local_98.id_ = INTEGER_LITERAL;
    local_98.physical_type_ = ~INVALID;
    local_98._2_6_ = 0;
    local_80.type_._0_8_ = ::std::__cxx11::string::_M_create((ulong *)&local_80,(ulong)&local_98);
    local_80.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._0_8_;
    builtin_strncpy((char *)local_80.type_._0_8_,"Unimplemented type for cast (%s -> %s)",0x26);
    local_80.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_98._0_8_;
    *(char *)(local_80.type_._0_8_ + local_98._0_8_) = '\0';
    NotImplementedException::NotImplementedException<duckdb::PhysicalType,duckdb::PhysicalType>
              (pNVar5,(string *)&local_80,INT32,INT64);
    __cxa_throw(pNVar5,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  case TIME:
    pNVar5 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    local_80.type_._0_8_ =
         &local_80.type_.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    local_98.id_ = INTEGER_LITERAL;
    local_98.physical_type_ = ~INVALID;
    local_98._2_6_ = 0;
    local_80.type_._0_8_ = ::std::__cxx11::string::_M_create((ulong *)&local_80,(ulong)&local_98);
    local_80.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._0_8_;
    builtin_strncpy((char *)local_80.type_._0_8_,"Unimplemented type for cast (%s -> %s)",0x26);
    local_80.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_98._0_8_;
    *(char *)(local_80.type_._0_8_ + local_98._0_8_) = '\0';
    NotImplementedException::NotImplementedException<duckdb::PhysicalType,duckdb::PhysicalType>
              (pNVar5,(string *)&local_80,INT64,INT64);
    __cxa_throw(pNVar5,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  case TIMESTAMP_SEC:
    this_00 = (duckdb *)&local_80;
    bVar3 = TryCast::Operation<duckdb::timestamp_sec_t,duckdb::timestamp_sec_t>
                      ((timestamp_sec_t)(this->value_).timestamp_s.super_timestamp_t.value,
                       (timestamp_sec_t *)this_00,false);
    local_98._0_8_ = local_80.type_._0_8_;
    if (!bVar3) {
      __return_storage_ptr__ = (string *)0x10;
      __cxa_allocate_exception();
      CastExceptionText<duckdb::timestamp_sec_t,duckdb::timestamp_sec_t>
                (__return_storage_ptr__,this_00,input_00);
LAB_0032f14c:
      pIVar6 = (InternalException *)__cxa_allocate_exception(0x10);
      local_80.type_._0_8_ =
           &local_80.type_.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_80,"Invalid Internal Type for ENUMs","");
      InternalException::InternalException(pIVar6,(string *)&local_80);
      __cxa_throw(pIVar6,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
    break;
  case TIMESTAMP_MS:
    pNVar5 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    local_80.type_._0_8_ =
         &local_80.type_.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    local_98.id_ = INTEGER_LITERAL;
    local_98.physical_type_ = ~INVALID;
    local_98._2_6_ = 0;
    local_80.type_._0_8_ = ::std::__cxx11::string::_M_create((ulong *)&local_80,(ulong)&local_98);
    local_80.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._0_8_;
    builtin_strncpy((char *)local_80.type_._0_8_,"Unimplemented type for cast (%s -> %s)",0x26);
    local_80.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_98._0_8_;
    *(char *)(local_80.type_._0_8_ + local_98._0_8_) = '\0';
    NotImplementedException::NotImplementedException<duckdb::PhysicalType,duckdb::PhysicalType>
              (pNVar5,(string *)&local_80,INT64,INT64);
    __cxa_throw(pNVar5,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  case TIMESTAMP:
    input.value = (this->value_).timestamp.value;
    bVar3 = TryCast::Operation<duckdb::timestamp_t,duckdb::timestamp_sec_t>
                      (input,(timestamp_sec_t *)&local_98,false);
    if (!bVar3) {
      auVar7 = __cxa_allocate_exception(0x10);
      CastExceptionText<duckdb::timestamp_t,duckdb::timestamp_sec_t>
                ((string *)&local_80,(duckdb *)input.value,(timestamp_t)auVar7._8_8_);
      InvalidInputException::InvalidInputException(auVar7._0_8_,(string *)&local_80);
      __cxa_throw(auVar7._0_8_,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error
                 );
    }
    break;
  case TIMESTAMP_NS:
    pNVar5 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    local_80.type_._0_8_ =
         &local_80.type_.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    local_98.id_ = INTEGER_LITERAL;
    local_98.physical_type_ = ~INVALID;
    local_98._2_6_ = 0;
    local_80.type_._0_8_ = ::std::__cxx11::string::_M_create((ulong *)&local_80,(ulong)&local_98);
    local_80.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._0_8_;
    builtin_strncpy((char *)local_80.type_._0_8_,"Unimplemented type for cast (%s -> %s)",0x26);
    local_80.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_98._0_8_;
    *(char *)(local_80.type_._0_8_ + local_98._0_8_) = '\0';
    NotImplementedException::NotImplementedException<duckdb::PhysicalType,duckdb::PhysicalType>
              (pNVar5,(string *)&local_80,INT64,INT64);
    __cxa_throw(pNVar5,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  case DECIMAL:
    LogicalType::LogicalType(&local_98,DOUBLE);
    DefaultCastAs(&local_80,this,&local_98,false);
    tVar4 = GetValueInternal<duckdb::timestamp_sec_t>(&local_80);
    ~Value(&local_80);
    LogicalType::~LogicalType(&local_98);
    local_98._0_8_ = tVar4;
    break;
  case FLOAT:
    pNVar5 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    local_80.type_._0_8_ =
         &local_80.type_.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    local_98.id_ = INTEGER_LITERAL;
    local_98.physical_type_ = ~INVALID;
    local_98._2_6_ = 0;
    local_80.type_._0_8_ = ::std::__cxx11::string::_M_create((ulong *)&local_80,(ulong)&local_98);
    local_80.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._0_8_;
    builtin_strncpy((char *)local_80.type_._0_8_,"Unimplemented type for cast (%s -> %s)",0x26);
    local_80.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_98._0_8_;
    *(char *)(local_80.type_._0_8_ + local_98._0_8_) = '\0';
    NotImplementedException::NotImplementedException<duckdb::PhysicalType,duckdb::PhysicalType>
              (pNVar5,(string *)&local_80,FLOAT,INT64);
    __cxa_throw(pNVar5,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  case DOUBLE:
    pNVar5 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    local_80.type_._0_8_ =
         &local_80.type_.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    local_98.id_ = INTEGER_LITERAL;
    local_98.physical_type_ = ~INVALID;
    local_98._2_6_ = 0;
    local_80.type_._0_8_ = ::std::__cxx11::string::_M_create((ulong *)&local_80,(ulong)&local_98);
    local_80.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._0_8_;
    builtin_strncpy((char *)local_80.type_._0_8_,"Unimplemented type for cast (%s -> %s)",0x26);
    local_80.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_98._0_8_;
    *(char *)(local_80.type_._0_8_ + local_98._0_8_) = '\0';
    NotImplementedException::NotImplementedException<duckdb::PhysicalType,duckdb::PhysicalType>
              (pNVar5,(string *)&local_80,DOUBLE,INT64);
    __cxa_throw(pNVar5,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  case VARCHAR:
    StringValue::Get_abi_cxx11_(this);
    pNVar5 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    local_80.type_._0_8_ =
         &local_80.type_.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    local_98.id_ = INTEGER_LITERAL;
    local_98.physical_type_ = ~INVALID;
    local_98._2_6_ = 0;
    local_80.type_._0_8_ = ::std::__cxx11::string::_M_create((ulong *)&local_80,(ulong)&local_98);
    local_80.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._0_8_;
    builtin_strncpy((char *)local_80.type_._0_8_,"Unimplemented type for cast (%s -> %s)",0x26);
    local_80.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_98._0_8_;
    *(char *)(local_80.type_._0_8_ + local_98._0_8_) = '\0';
    NotImplementedException::NotImplementedException<duckdb::PhysicalType,duckdb::PhysicalType>
              (pNVar5,(string *)&local_80,VARCHAR,INT64);
    __cxa_throw(pNVar5,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  case INTERVAL:
    pNVar5 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    local_80.type_._0_8_ =
         &local_80.type_.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    local_98.id_ = INTEGER_LITERAL;
    local_98.physical_type_ = ~INVALID;
    local_98._2_6_ = 0;
    local_80.type_._0_8_ = ::std::__cxx11::string::_M_create((ulong *)&local_80,(ulong)&local_98);
    local_80.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._0_8_;
    builtin_strncpy((char *)local_80.type_._0_8_,"Unimplemented type for cast (%s -> %s)",0x26);
    local_80.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_98._0_8_;
    *(char *)(local_80.type_._0_8_ + local_98._0_8_) = '\0';
    NotImplementedException::NotImplementedException<duckdb::PhysicalType,duckdb::PhysicalType>
              (pNVar5,(string *)&local_80,INTERVAL,INT64);
    __cxa_throw(pNVar5,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  case UTINYINT:
    pNVar5 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    local_80.type_._0_8_ =
         &local_80.type_.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    local_98.id_ = INTEGER_LITERAL;
    local_98.physical_type_ = ~INVALID;
    local_98._2_6_ = 0;
    local_80.type_._0_8_ = ::std::__cxx11::string::_M_create((ulong *)&local_80,(ulong)&local_98);
    local_80.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._0_8_;
    builtin_strncpy((char *)local_80.type_._0_8_,"Unimplemented type for cast (%s -> %s)",0x26);
    local_80.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_98._0_8_;
    *(char *)(local_80.type_._0_8_ + local_98._0_8_) = '\0';
    NotImplementedException::NotImplementedException<duckdb::PhysicalType,duckdb::PhysicalType>
              (pNVar5,(string *)&local_80,UINT8,INT64);
    __cxa_throw(pNVar5,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  case USMALLINT:
    pNVar5 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    local_80.type_._0_8_ =
         &local_80.type_.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    local_98.id_ = INTEGER_LITERAL;
    local_98.physical_type_ = ~INVALID;
    local_98._2_6_ = 0;
    local_80.type_._0_8_ = ::std::__cxx11::string::_M_create((ulong *)&local_80,(ulong)&local_98);
    local_80.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._0_8_;
    builtin_strncpy((char *)local_80.type_._0_8_,"Unimplemented type for cast (%s -> %s)",0x26);
    local_80.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_98._0_8_;
    *(char *)(local_80.type_._0_8_ + local_98._0_8_) = '\0';
    NotImplementedException::NotImplementedException<duckdb::PhysicalType,duckdb::PhysicalType>
              (pNVar5,(string *)&local_80,UINT16,INT64);
    __cxa_throw(pNVar5,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  case UINTEGER:
    pNVar5 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    local_80.type_._0_8_ =
         &local_80.type_.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    local_98.id_ = INTEGER_LITERAL;
    local_98.physical_type_ = ~INVALID;
    local_98._2_6_ = 0;
    local_80.type_._0_8_ = ::std::__cxx11::string::_M_create((ulong *)&local_80,(ulong)&local_98);
    local_80.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._0_8_;
    builtin_strncpy((char *)local_80.type_._0_8_,"Unimplemented type for cast (%s -> %s)",0x26);
    local_80.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_98._0_8_;
    *(char *)(local_80.type_._0_8_ + local_98._0_8_) = '\0';
    NotImplementedException::NotImplementedException<duckdb::PhysicalType,duckdb::PhysicalType>
              (pNVar5,(string *)&local_80,UINT32,INT64);
    __cxa_throw(pNVar5,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  case UBIGINT:
    pNVar5 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    local_80.type_._0_8_ =
         &local_80.type_.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    local_98.id_ = INTEGER_LITERAL;
    local_98.physical_type_ = ~INVALID;
    local_98._2_6_ = 0;
    local_80.type_._0_8_ = ::std::__cxx11::string::_M_create((ulong *)&local_80,(ulong)&local_98);
    local_80.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._0_8_;
    builtin_strncpy((char *)local_80.type_._0_8_,"Unimplemented type for cast (%s -> %s)",0x26);
    local_80.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_98._0_8_;
    *(char *)(local_80.type_._0_8_ + local_98._0_8_) = '\0';
    NotImplementedException::NotImplementedException<duckdb::PhysicalType,duckdb::PhysicalType>
              (pNVar5,(string *)&local_80,UINT64,INT64);
    __cxa_throw(pNVar5,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  case TIMESTAMP_TZ:
    pNVar5 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    local_80.type_._0_8_ =
         &local_80.type_.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    local_98.id_ = INTEGER_LITERAL;
    local_98.physical_type_ = ~INVALID;
    local_98._2_6_ = 0;
    local_80.type_._0_8_ = ::std::__cxx11::string::_M_create((ulong *)&local_80,(ulong)&local_98);
    local_80.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._0_8_;
    builtin_strncpy((char *)local_80.type_._0_8_,"Unimplemented type for cast (%s -> %s)",0x26);
    local_80.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_98._0_8_;
    *(char *)(local_80.type_._0_8_ + local_98._0_8_) = '\0';
    NotImplementedException::NotImplementedException<duckdb::PhysicalType,duckdb::PhysicalType>
              (pNVar5,(string *)&local_80,INT64,INT64);
    __cxa_throw(pNVar5,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  case TIME_TZ:
    pNVar5 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    local_80.type_._0_8_ =
         &local_80.type_.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    local_98.id_ = INTEGER_LITERAL;
    local_98.physical_type_ = ~INVALID;
    local_98._2_6_ = 0;
    local_80.type_._0_8_ = ::std::__cxx11::string::_M_create((ulong *)&local_80,(ulong)&local_98);
    local_80.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._0_8_;
    builtin_strncpy((char *)local_80.type_._0_8_,"Unimplemented type for cast (%s -> %s)",0x26);
    local_80.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_98._0_8_;
    *(char *)(local_80.type_._0_8_ + local_98._0_8_) = '\0';
    NotImplementedException::NotImplementedException<duckdb::PhysicalType,duckdb::PhysicalType>
              (pNVar5,(string *)&local_80,INVALID,INT64);
    __cxa_throw(pNVar5,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  case UHUGEINT:
    pNVar5 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    local_80.type_._0_8_ =
         &local_80.type_.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    local_98.id_ = INTEGER_LITERAL;
    local_98.physical_type_ = ~INVALID;
    local_98._2_6_ = 0;
    local_80.type_._0_8_ = ::std::__cxx11::string::_M_create((ulong *)&local_80,(ulong)&local_98);
    local_80.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._0_8_;
    builtin_strncpy((char *)local_80.type_._0_8_,"Unimplemented type for cast (%s -> %s)",0x26);
    local_80.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_98._0_8_;
    *(char *)(local_80.type_._0_8_ + local_98._0_8_) = '\0';
    NotImplementedException::NotImplementedException<duckdb::PhysicalType,duckdb::PhysicalType>
              (pNVar5,(string *)&local_80,UINT128,INT64);
    __cxa_throw(pNVar5,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  case HUGEINT:
  case UUID:
    pNVar5 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    local_80.type_._0_8_ =
         &local_80.type_.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    local_98.id_ = INTEGER_LITERAL;
    local_98.physical_type_ = ~INVALID;
    local_98._2_6_ = 0;
    local_80.type_._0_8_ = ::std::__cxx11::string::_M_create((ulong *)&local_80,(ulong)&local_98);
    local_80.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._0_8_;
    builtin_strncpy((char *)local_80.type_._0_8_,"Unimplemented type for cast (%s -> %s)",0x26);
    local_80.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_98._0_8_;
    *(char *)(local_80.type_._0_8_ + local_98._0_8_) = '\0';
    NotImplementedException::NotImplementedException<duckdb::PhysicalType,duckdb::PhysicalType>
              (pNVar5,(string *)&local_80,INT128,INT64);
    __cxa_throw(pNVar5,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  default:
    if (LVar1 == ENUM) {
      PVar2 = (this->type_).physical_type_;
      if (PVar2 == UINT32) {
        tVar4 = Cast::Operation<unsigned_int,duckdb::timestamp_sec_t>((this->value_).uinteger);
        return (timestamp_sec_t)tVar4.super_timestamp_t.value;
      }
      if (PVar2 == UINT16) {
        tVar4 = Cast::Operation<unsigned_short,duckdb::timestamp_sec_t>((this->value_).usmallint);
        return (timestamp_sec_t)tVar4.super_timestamp_t.value;
      }
      if (PVar2 == UINT8) {
        tVar4 = Cast::Operation<unsigned_char,duckdb::timestamp_sec_t>((this->value_).utinyint);
        return (timestamp_sec_t)tVar4.super_timestamp_t.value;
      }
      goto LAB_0032f14c;
    }
  case CHAR:
  case BLOB:
  case TIMESTAMP_TZ|SQLNULL:
  case TIME_TZ|SQLNULL:
  case BIT:
  case STRING_LITERAL:
  case INTEGER_LITERAL:
  case VARINT:
  case 0x28:
  case 0x29:
  case TIMESTAMP_TZ|BOOLEAN:
  case TIMESTAMP_TZ|TINYINT:
  case TIMESTAMP_TZ|SMALLINT:
  case TIMESTAMP_TZ|INTEGER:
  case TIMESTAMP_TZ|BIGINT:
  case TIMESTAMP_TZ|DATE:
  case TIMESTAMP_TZ|TIME:
  case POINTER:
  case TIMESTAMP_TZ|TIMESTAMP_NS:
  case VALIDITY:
    pNVar5 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    local_80.type_._0_8_ =
         &local_80.type_.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_80,"Unimplemented type \"%s\" for GetValue()","");
    LogicalType::ToString_abi_cxx11_(&local_40,&this->type_);
    NotImplementedException::NotImplementedException<std::__cxx11::string>
              (pNVar5,(string *)&local_80,&local_40);
    __cxa_throw(pNVar5,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  }
  return (timestamp_sec_t)(timestamp_t)local_98._0_8_;
}

Assistant:

T Value::GetValueInternal() const {
	if (IsNull()) {
		throw InternalException("Calling GetValueInternal on a value that is NULL");
	}
	switch (type_.id()) {
	case LogicalTypeId::BOOLEAN:
		return Cast::Operation<bool, T>(value_.boolean);
	case LogicalTypeId::TINYINT:
		return Cast::Operation<int8_t, T>(value_.tinyint);
	case LogicalTypeId::SMALLINT:
		return Cast::Operation<int16_t, T>(value_.smallint);
	case LogicalTypeId::INTEGER:
		return Cast::Operation<int32_t, T>(value_.integer);
	case LogicalTypeId::BIGINT:
		return Cast::Operation<int64_t, T>(value_.bigint);
	case LogicalTypeId::HUGEINT:
	case LogicalTypeId::UUID:
		return Cast::Operation<hugeint_t, T>(value_.hugeint);
	case LogicalTypeId::UHUGEINT:
		return Cast::Operation<uhugeint_t, T>(value_.uhugeint);
	case LogicalTypeId::DATE:
		return Cast::Operation<date_t, T>(value_.date);
	case LogicalTypeId::TIME:
		return Cast::Operation<dtime_t, T>(value_.time);
	case LogicalTypeId::TIME_TZ:
		return Cast::Operation<dtime_tz_t, T>(value_.timetz);
	case LogicalTypeId::TIMESTAMP:
		return Cast::Operation<timestamp_t, T>(value_.timestamp);
	case LogicalTypeId::TIMESTAMP_SEC:
		return Cast::Operation<timestamp_sec_t, T>(value_.timestamp_s);
	case LogicalTypeId::TIMESTAMP_MS:
		return Cast::Operation<timestamp_ms_t, T>(value_.timestamp_ms);
	case LogicalTypeId::TIMESTAMP_NS:
		return Cast::Operation<timestamp_ns_t, T>(value_.timestamp_ns);
	case LogicalTypeId::TIMESTAMP_TZ:
		return Cast::Operation<timestamp_tz_t, T>(value_.timestamp_tz);
	case LogicalTypeId::UTINYINT:
		return Cast::Operation<uint8_t, T>(value_.utinyint);
	case LogicalTypeId::USMALLINT:
		return Cast::Operation<uint16_t, T>(value_.usmallint);
	case LogicalTypeId::UINTEGER:
		return Cast::Operation<uint32_t, T>(value_.uinteger);
	case LogicalTypeId::UBIGINT:
		return Cast::Operation<uint64_t, T>(value_.ubigint);
	case LogicalTypeId::FLOAT:
		return Cast::Operation<float, T>(value_.float_);
	case LogicalTypeId::DOUBLE:
		return Cast::Operation<double, T>(value_.double_);
	case LogicalTypeId::VARCHAR:
		return Cast::Operation<string_t, T>(StringValue::Get(*this).c_str());
	case LogicalTypeId::INTERVAL:
		return Cast::Operation<interval_t, T>(value_.interval);
	case LogicalTypeId::DECIMAL:
		return DefaultCastAs(LogicalType::DOUBLE).GetValueInternal<T>();
	case LogicalTypeId::ENUM: {
		switch (type_.InternalType()) {
		case PhysicalType::UINT8:
			return Cast::Operation<uint8_t, T>(value_.utinyint);
		case PhysicalType::UINT16:
			return Cast::Operation<uint16_t, T>(value_.usmallint);
		case PhysicalType::UINT32:
			return Cast::Operation<uint32_t, T>(value_.uinteger);
		default:
			throw InternalException("Invalid Internal Type for ENUMs");
		}
	}
	default:
		throw NotImplementedException("Unimplemented type \"%s\" for GetValue()", type_.ToString());
	}
}